

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32 res)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  pair<const_char_*,_int> pVar6;
  
  uVar4 = (ulong)res;
  pbVar2 = (byte *)(p + 1);
  lVar5 = -0x15;
  do {
    if (lVar5 == 0) {
      if ((byte)p[4] < 8) {
        uVar3 = (int)uVar4 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000;
        pbVar2 = (byte *)(p + 5);
        if (0x7fffffef < uVar3) {
          uVar3 = 0;
          pbVar2 = (byte *)0x0;
        }
        uVar4 = (ulong)uVar3;
      }
      else {
        pbVar2 = (byte *)0x0;
        uVar4 = 0;
      }
      break;
    }
    bVar1 = *pbVar2;
    uVar4 = (ulong)((int)uVar4 + (bVar1 - 1 << ((char)lVar5 + 0x1cU & 0x1f)));
    pbVar2 = pbVar2 + 1;
    lVar5 = lVar5 + 7;
  } while ((char)bVar1 < '\0');
  pVar6._8_8_ = uVar4;
  pVar6.first = (char *)pbVar2;
  return pVar6;
}

Assistant:

std::pair<const char*, int32> ReadSizeFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}